

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::GetFileName(string *__return_storage_ptr__,string *file_path)

{
  long lVar1;
  uint uVar2;
  size_type sVar3;
  
  lVar1 = ::std::__cxx11::string::find_last_of((char *)file_path,0x1fe2f09);
  if (lVar1 == -1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file_path);
  }
  else {
    sVar3 = file_path->_M_string_length;
    lVar1 = ::std::__cxx11::string::find_first_not_of((char *)file_path,0x1fe2f0c);
    if (lVar1 == -1) {
      do {
        sVar3 = sVar3 - 1;
        if ((sVar3 == 0) ||
           (uVar2 = (byte)(file_path->_M_dataplus)._M_p[sVar3] - 0x2e, 0x2e < uVar2)) break;
      } while ((0x400000000003U >> ((ulong)uVar2 & 0x3f) & 1) != 0);
      ::std::__cxx11::string::find_last_of((char *)file_path,0x1fe2f09);
    }
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file_path);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::GetFileName(const string &file_path) {

	idx_t pos = file_path.find_last_of("/\\");
	if (pos == string::npos) {
		return file_path;
	}
	auto end = file_path.size() - 1;

	// If the rest of the string is just slashes or dots, trim them
	if (file_path.find_first_not_of("/\\.", pos) == string::npos) {
		// Trim the trailing slashes and dots
		while (end > 0 && (file_path[end] == '/' || file_path[end] == '.' || file_path[end] == '\\')) {
			end--;
		}

		// Now find the next slash
		pos = file_path.find_last_of("/\\", end);
		if (pos == string::npos) {
			return file_path.substr(0, end + 1);
		}
	}

	return file_path.substr(pos + 1, end - pos);
}